

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_644e4c::HandleExportAndroidMKMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  bool bVar2;
  int iVar3;
  string *psVar4;
  long lVar5;
  cmGlobalGenerator *pcVar6;
  cmExportSet *pcVar7;
  string *__args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_4;
  string *__args_5;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  undefined1 local_3db [2];
  bool exportOld;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [40];
  string fname;
  MessageLevel message;
  string exp;
  undefined1 local_348 [32];
  string filename;
  string name_space;
  string local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  Helper helper;
  undefined1 local_278 [32];
  size_type local_258;
  pointer local_250;
  undefined8 local_248;
  char *local_240;
  string local_238;
  ParseResult local_218;
  cmInstallCommandArguments ica;
  
  Helper::Helper(&helper,status);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e8,helper.DefaultComponentName._M_dataplus._M_p,
             helper.DefaultComponentName._M_dataplus._M_p +
             helper.DefaultComponentName._M_string_length);
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  exp._M_dataplus._M_p = (pointer)&exp.field_2;
  exp._M_string_length = 0;
  exp.field_2._M_local_buf[0] = '\0';
  name_space._M_dataplus._M_p = (pointer)&name_space.field_2;
  name_space._M_string_length = 0;
  name_space.field_2._M_local_buf[0] = '\0';
  exportOld = false;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  name.super_string_view._M_str = "EXPORT_ANDROID_MK";
  name.super_string_view._M_len = 0x11;
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(&ica.super_cmArgumentParser<void>,name,&exp);
  name_00.super_string_view._M_str = "NAMESPACE";
  name_00.super_string_view._M_len = 9;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_00,&name_space);
  name_01.super_string_view._M_str = "EXPORT_LINK_INTERFACE_LIBRARIES";
  name_01.super_string_view._M_len = 0x1f;
  cmArgumentParser<void>::Bind<bool>(&ica.super_cmArgumentParser<void>,name_01,&exportOld);
  name_02.super_string_view._M_str = "FILE";
  name_02.super_string_view._M_len = 4;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&ica.super_cmArgumentParser<void>,name_02,&filename);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_218,&ica.super_cmArgumentParser<void>,args,&unknownArgs,0);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_218);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = cmInstallCommandArguments::Finalize(&ica);
    if (bVar2) {
      psVar4 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
      if (psVar4->_M_string_length == 0) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_278._8_8_ = (pbVar1->_M_dataplus)._M_p;
        local_278._0_8_ = pbVar1->_M_string_length;
        local_278[0x10] = '\x16';
        local_278[0x11] = '\0';
        local_278[0x12] = '\0';
        local_278[0x13] = '\0';
        local_278[0x14] = '\0';
        local_278[0x15] = '\0';
        local_278[0x16] = '\0';
        local_278[0x17] = '\0';
        local_278._24_8_ = " given no DESTINATION!";
        views_01._M_len = 2;
        views_01._M_array = (iterator)local_278;
        cmCatViews_abi_cxx11_((string *)local_3d8,views_01);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_0020d879;
      }
      fname._M_dataplus._M_p = (pointer)&fname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fname,filename._M_dataplus._M_p,
                 filename._M_dataplus._M_p + filename._M_string_length);
      lVar5 = std::__cxx11::string::find_first_of((char *)&fname,0x695dc3,0);
      if (lVar5 == -1) {
        if (fname._M_string_length == 0) {
          bVar2 = false;
        }
        else {
          cmsys::SystemTools::GetFilenameLastExtension(&local_238,&fname);
          iVar3 = std::__cxx11::string::compare((char *)&local_238);
          bVar2 = iVar3 != 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar2) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_278._8_8_ = (pbVar1->_M_dataplus)._M_p;
          local_278._0_8_ = pbVar1->_M_string_length;
          local_278[0x10] = '!';
          local_278[0x11] = '\0';
          local_278[0x12] = '\0';
          local_278[0x13] = '\0';
          local_278[0x14] = '\0';
          local_278[0x15] = '\0';
          local_278[0x16] = '\0';
          local_278[0x17] = '\0';
          local_278._24_8_ = " given invalid export file name \"";
          local_258 = fname._M_string_length;
          local_250 = fname._M_dataplus._M_p;
          local_248 = 0x3a;
          local_240 = "\".  The FILE argument must specify a name ending in \".mk\".";
          views_02._M_len = 4;
          views_02._M_array = (iterator)local_278;
          cmCatViews_abi_cxx11_((string *)local_3d8,views_02);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_0020db6f;
        }
        lVar5 = std::__cxx11::string::find_first_of((char *)&fname,0x695dc3,0);
        if (lVar5 != -1) {
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_278._8_8_ = (pbVar1->_M_dataplus)._M_p;
          local_278._0_8_ = pbVar1->_M_string_length;
          local_3d8._0_8_ = &DAT_00000014;
          local_3d8._8_8_ = " given export name \"";
          cmStrCat<std::__cxx11::string,char[144]>
                    ((string *)local_348,(cmAlphaNum *)local_278,(cmAlphaNum *)local_3d8,&exp,
                     (char (*) [144])
                     "\".  This name cannot be safely converted to a file name.  Specify a different export name or use the FILE option to set a file name explicitly."
                    );
          std::__cxx11::string::_M_assign((string *)&status->Error);
          pcVar7 = (cmExportSet *)local_348._0_8_;
          if ((cmExportSet *)local_348._0_8_ != (cmExportSet *)(local_348 + 0x10))
          goto LAB_0020db82;
          goto LAB_0020db8a;
        }
        if (fname._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)&fname,"Android.mk");
        }
        pcVar6 = cmMakefile::GetGlobalGenerator(helper.Makefile);
        pcVar7 = cmExportSetMap::operator[](&pcVar6->ExportSets,&exp);
        message = cmInstallGenerator::SelectMessageLevel(helper.Makefile,false);
        this = helper.Makefile;
        local_348._0_8_ = pcVar7;
        psVar4 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
        __args_3 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(&ica);
        __args_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmInstallCommandArguments::GetConfigurations_abi_cxx11_(&ica);
        __args_5 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
        local_3db[1] = cmInstallCommandArguments::GetExcludeFromAll(&ica);
        local_3db[0] = 1;
        cmMakefile::GetBacktrace(helper.Makefile);
        std::
        make_unique<cmInstallExportGenerator,cmExportSet*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[1],bool&,bool,cmListFileBacktrace>
                  ((cmExportSet **)local_3d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   psVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)__args_3,__args_4,(MessageLevel *)__args_5,(bool *)&message,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_3db + 1),&fname,(char (*) [1])&name_space,(bool *)0x6f6625,&exportOld,
                   (cmListFileBacktrace *)local_3db);
        local_3c8._32_8_ = local_3d8._0_8_;
        local_3d8._0_8_ = (long *)0x0;
        cmMakefile::AddInstallGenerator
                  (this,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                        (local_3c8 + 0x20));
        if ((cmExportSet *)local_3c8._32_8_ != (cmExportSet *)0x0) {
          (*(code *)(((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                       *)local_3c8._32_8_)->
                    super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>)();
        }
        local_3c8._32_8_ = 0;
        if ((long *)local_3d8._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_3d8._0_8_ + 8))();
        }
        local_3d8._0_8_ = (cmExportSet *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
        }
        bVar2 = true;
      }
      else {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_278._8_8_ = (pbVar1->_M_dataplus)._M_p;
        local_278._0_8_ = pbVar1->_M_string_length;
        local_278[0x10] = '!';
        local_278[0x11] = '\0';
        local_278[0x12] = '\0';
        local_278[0x13] = '\0';
        local_278[0x14] = '\0';
        local_278[0x15] = '\0';
        local_278[0x16] = '\0';
        local_278[0x17] = '\0';
        local_278._24_8_ = " given invalid export file name \"";
        local_258 = fname._M_string_length;
        local_250 = fname._M_dataplus._M_p;
        local_248 = 0x5c;
        local_240 = 
        "\".  The FILE argument may not contain a path.  Specify the path in the DESTINATION argument."
        ;
        views_00._M_len = 4;
        views_00._M_array = (iterator)local_278;
        cmCatViews_abi_cxx11_((string *)local_3d8,views_00);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0020db6f:
        local_348._16_8_ = local_3c8._0_8_;
        pcVar7 = (cmExportSet *)local_3d8._0_8_;
        if ((cmExportSet *)local_3d8._0_8_ != (cmExportSet *)local_3c8) {
LAB_0020db82:
          operator_delete(pcVar7,local_348._16_8_ + 1);
        }
LAB_0020db8a:
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fname._M_dataplus._M_p != &fname.field_2) {
        operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0020d98b;
    }
  }
  else {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_278._8_8_ = (pbVar1->_M_dataplus)._M_p;
    local_278._0_8_ = pbVar1->_M_string_length;
    local_278[0x10] = '\x19';
    local_278[0x11] = '\0';
    local_278[0x12] = '\0';
    local_278[0x13] = '\0';
    local_278[0x14] = '\0';
    local_278[0x15] = '\0';
    local_278[0x16] = '\0';
    local_278[0x17] = '\0';
    local_278._24_8_ = " given unknown argument \"";
    local_250 = ((unknownArgs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_258 = (unknownArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    local_248 = 2;
    local_240 = "\".";
    views._M_len = 4;
    views._M_array = (iterator)local_278;
    cmCatViews_abi_cxx11_((string *)local_3d8,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0020d879:
    if ((cmExportSet *)local_3d8._0_8_ != (cmExportSet *)local_3c8) {
      operator_delete((void *)local_3d8._0_8_,local_3c8._0_8_ + 1);
    }
  }
  bVar2 = false;
LAB_0020d98b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,
                    CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                             filename.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name_space._M_dataplus._M_p != &name_space.field_2) {
    operator_delete(name_space._M_dataplus._M_p,
                    CONCAT71(name_space.field_2._M_allocated_capacity._1_7_,
                             name_space.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exp._M_dataplus._M_p != &exp.field_2) {
    operator_delete(exp._M_dataplus._M_p,
                    CONCAT71(exp.field_2._M_allocated_capacity._1_7_,exp.field_2._M_local_buf[0]) +
                    1);
  }
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)helper.DefaultComponentName._M_dataplus._M_p != &helper.DefaultComponentName.field_2) {
    operator_delete(helper.DefaultComponentName._M_dataplus._M_p,
                    helper.DefaultComponentName.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool HandleExportAndroidMKMode(std::vector<std::string> const& args,
                               cmExecutionStatus& status)
{
#ifndef CMAKE_BOOTSTRAP
  Helper helper(status);

  // This is the EXPORT mode.
  cmInstallCommandArguments ica(helper.DefaultComponentName);

  std::string exp;
  std::string name_space;
  bool exportOld = false;
  std::string filename;

  ica.Bind("EXPORT_ANDROID_MK"_s, exp);
  ica.Bind("NAMESPACE"_s, name_space);
  ica.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, exportOld);
  ica.Bind("FILE"_s, filename);

  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Check the file name.
  std::string fname = filename;
  if (fname.find_first_of(":/\\") != std::string::npos) {
    status.SetError(cmStrCat(args[0], " given invalid export file name \"",
                             fname,
                             "\".  The FILE argument may not contain a path.  "
                             "Specify the path in the DESTINATION argument."));
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".mk") {
    status.SetError(cmStrCat(
      args[0], " given invalid export file name \"", fname,
      R"(".  The FILE argument must specify a name ending in ".mk".)"));
    return false;
  }
  if (fname.find_first_of(":/\\") != std::string::npos) {
    status.SetError(
      cmStrCat(args[0], " given export name \"", exp,
               "\".  "
               "This name cannot be safely converted to a file name.  "
               "Specify a different export name or use the FILE option to set "
               "a file name explicitly."));
    return false;
  }
  // Use the default name
  if (fname.empty()) {
    fname = "Android.mk";
  }

  cmExportSet& exportSet =
    helper.Makefile->GetGlobalGenerator()->GetExportSets()[exp];

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile);

  // Create the export install generator.
  helper.Makefile->AddInstallGenerator(
    cm::make_unique<cmInstallExportGenerator>(
      &exportSet, ica.GetDestination(), ica.GetPermissions(),
      ica.GetConfigurations(), ica.GetComponent(), message,
      ica.GetExcludeFromAll(), fname, name_space, "", exportOld, true,
      helper.Makefile->GetBacktrace()));

  return true;
#else
  static_cast<void>(args);
  status.SetError("EXPORT_ANDROID_MK not supported in bootstrap cmake");
  return false;
#endif
}